

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O3

void Memory::DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<int>>
               (AllocatorType *allocator,AuxArray<int> *obj,size_t plusSize)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (0xfffffffffffffffb < plusSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x130,"(sizeof(T) + plusSize >= sizeof(T))",
                       "sizeof(T) + plusSize >= sizeof(T)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (&allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             obj,plusSize + 4);
  return;
}

Assistant:

void DeleteObject(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, T * obj, size_t plusSize)
{
    obj->~T();

    // DeleteObject can only be called when an object is allocated successfully.
    // So the add should never overflow
    Assert(sizeof(T) + plusSize >= sizeof(T));

    auto freeFunc = AllocatorInfo<TAllocator, T>::InstAllocatorFunc::GetFreeFunc(); // Use InstAllocatorFunc
    (allocator->*freeFunc)(
        (void*)obj, _AllocatorDelete<T, deleteFlags>::Size(plusSize));
}